

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O2

void __thiscall KDReports::Test::wrongTopElement(Test *this)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  ErrorDetails details;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  QFile file;
  Report report;
  
  QString::QString((QString *)&report,":/wrongTopElement.xml");
  QFile::QFile(&file,(QString *)&report);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&report);
  bVar1 = (bool)QFile::open(&file,1);
  cVar2 = QTest::qVerify(bVar1,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0xd7);
  if (cVar2 != '\0') {
    KDReports::Report::Report(&report,(QObject *)0x0);
    KDReports::ErrorDetails::ErrorDetails(&details);
    bVar3 = KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!report.loadFromXML(&file, &details)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0xda);
    if (cVar2 != '\0') {
      iVar4 = KDReports::ErrorDetails::line();
      cVar2 = QTest::qCompare(iVar4,-1,"details.line()","-1",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0xdb);
      if (cVar2 != '\0') {
        iVar4 = KDReports::ErrorDetails::column();
        cVar2 = QTest::qCompare(iVar4,-1,"details.column()","-1",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0xdc);
        if (cVar2 != '\0') {
          KDReports::ErrorDetails::driverMessage();
          QString::QString((QString *)&local_60,
                           "Expected \"<report>\" as the topmost element, but found \"<XreportX>\"")
          ;
          bVar1 = QTest::qCompare((QString *)&local_48,(QString *)&local_60,
                                  "details.driverMessage()",
                                  "QString(\"Expected \\\"<report>\\\" as the topmost element, but found \\\"<XreportX>\\\"\")"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0xdd);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
          if (bVar1) {
            KDReports::ErrorDetails::message();
            QString::QString((QString *)&local_60,
                             "Expected \"<report>\" as the topmost element, but found \"<XreportX>\""
                            );
            QTest::qCompare((QString *)&local_48,(QString *)&local_60,"details.message()",
                            "QString(\"Expected \\\"<report>\\\" as the topmost element, but found \\\"<XreportX>\\\"\")"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                            ,0xde);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
          }
        }
      }
    }
    KDReports::ErrorDetails::~ErrorDetails(&details);
    KDReports::Report::~Report(&report);
  }
  QFile::~QFile(&file);
  return;
}

Assistant:

void wrongTopElement()
    {
        QFile file(":/wrongTopElement.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        KDReports::ErrorDetails details;
        QVERIFY(!report.loadFromXML(&file, &details));
        QCOMPARE(details.line(), -1);
        QCOMPARE(details.column(), -1);
        QCOMPARE(details.driverMessage(), QString("Expected \"<report>\" as the topmost element, but found \"<XreportX>\""));
        QCOMPARE(details.message(), QString("Expected \"<report>\" as the topmost element, but found \"<XreportX>\""));
    }